

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  SharedValidator *pSVar1;
  anon_union_16_2_ecfd7102_for_Location_1 *paVar2;
  intrusive_list_base<wabt::ModuleField> *loc;
  int iVar3;
  ExternalKind kind;
  Module *this_00;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  Type *pTVar6;
  Type elem_type;
  pointer ppTVar7;
  ModuleField *pMVar8;
  pointer ppMVar9;
  Index IVar10;
  Result RVar11;
  ArrayType *array_type;
  Location *pLVar12;
  Type type;
  Type type_00;
  ModuleField *field_2;
  ModuleField *pMVar13;
  ModuleField *exprs;
  Type *pTVar14;
  ModuleField *field_10;
  ModuleField *field_3;
  Var *__return_storage_ptr__;
  ModuleField *field;
  Field *field_1;
  _func_int *p_Var15;
  string_view name;
  TypeMutVector type_muts;
  Type local_2f8;
  Type local_2f0;
  ExprVisitor local_2e8;
  TypeMut local_280;
  Var local_270;
  Var local_228;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  this_00 = this->current_module_;
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar13->type_ == Type) {
        pp_Var4 = pMVar13[1]._vptr_ModuleField;
        iVar3 = *(int *)(pp_Var4 + 9);
        if (iVar3 == 2) {
          RVar11 = SharedValidator::OnArrayType(pSVar1,&pMVar13->loc,*(TypeMut *)(pp_Var4 + 0xe));
LAB_00144605:
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        }
        else if (iVar3 == 1) {
          local_2e8.delegate_ = (Delegate *)0x0;
          local_2e8.state_stack_.
          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2e8.state_stack_.
          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var5 = pp_Var4[0xb];
          for (p_Var15 = pp_Var4[10]; p_Var15 != p_Var5; p_Var15 = p_Var15 + 0x30) {
            local_280.type = *(Type *)(p_Var15 + 0x20);
            local_280.mutable_ = (bool)p_Var15[0x28];
            if (local_2e8.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_2e8.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::
              _M_realloc_insert<wabt::TypeMut>
                        ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)&local_2e8,
                         (iterator)
                         local_2e8.state_stack_.
                         super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_280);
            }
            else {
              *(undefined4 *)
               ((long)local_2e8.state_stack_.
                      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8) = local_280._8_4_;
              *(Type *)local_2e8.state_stack_.
                       super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                       ._M_impl.super__Vector_impl_data._M_start = local_280.type;
              local_2e8.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)local_2e8.state_stack_.
                                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0xc);
            }
          }
          RVar11 = SharedValidator::OnStructType
                             (pSVar1,&pMVar13->loc,
                              (int)((ulong)((long)local_2e8.state_stack_.
                                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                           (long)local_2e8.delegate_) >> 2) * -0x55555555,
                              (TypeMut *)local_2e8.delegate_);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          if ((TypeMut *)local_2e8.delegate_ != (TypeMut *)0x0) {
            operator_delete(local_2e8.delegate_,
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_2e8.delegate_);
          }
        }
        else if (iVar3 == 0) {
          pTVar14 = (Type *)pp_Var4[10];
          p_Var15 = pp_Var4[0xb];
          p_Var5 = pp_Var4[0xe];
          pTVar6 = (Type *)pp_Var4[0xd];
          IVar10 = Module::GetFuncTypeIndex(this_00,(FuncSignature *)(pp_Var4 + 10));
          RVar11 = SharedValidator::OnFuncType
                             (pSVar1,&pMVar13->loc,
                              (Index)((ulong)((long)p_Var15 - (long)pTVar14) >> 3),pTVar14,
                              (Index)((ulong)((long)p_Var5 - (long)pTVar6) >> 3),pTVar6,IVar10);
          goto LAB_00144605;
        }
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar13->type_ != Import) goto switchD_0014466c_default;
      pp_Var4 = pMVar13[1]._vptr_ModuleField;
      switch(*(undefined4 *)(pp_Var4 + 9)) {
      case 0:
        __return_storage_ptr__ = &local_78;
        GetFuncTypeIndex(__return_storage_ptr__,this,&pMVar13->loc,
                         (FuncDeclaration *)(pp_Var4 + 0xe));
        RVar11 = SharedValidator::OnFunction(pSVar1,&pMVar13->loc,__return_storage_ptr__);
        goto LAB_001446c8;
      case 1:
        RVar11 = SharedValidator::OnTable
                           (pSVar1,&pMVar13->loc,*(Type *)(pp_Var4 + 0x11),(Limits *)(pp_Var4 + 0xe)
                           );
        break;
      case 2:
        RVar11 = SharedValidator::OnMemory
                           (pSVar1,&pMVar13->loc,(Limits *)(pp_Var4 + 0xe),
                            *(uint32_t *)(pp_Var4 + 0x11));
        break;
      case 3:
        RVar11 = SharedValidator::OnGlobalImport
                           (pSVar1,&pMVar13->loc,*(Type *)(pp_Var4 + 0xe),*(bool *)(pp_Var4 + 0xf));
        break;
      case 4:
        __return_storage_ptr__ = &local_c0;
        GetFuncTypeIndex(__return_storage_ptr__,this,&pMVar13->loc,
                         (FuncDeclaration *)(pp_Var4 + 0xe));
        RVar11 = SharedValidator::OnTag(pSVar1,&pMVar13->loc,__return_storage_ptr__);
LAB_001446c8:
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(__return_storage_ptr__);
      default:
        goto switchD_0014466c_default;
      }
      (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
switchD_0014466c_default:
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    do {
      if (pMVar13->type_ == Func) {
        GetFuncTypeIndex(&local_108,this,&pMVar13->loc,
                         (FuncDeclaration *)&pMVar13[1].loc.filename._M_str);
        RVar11 = SharedValidator::OnFunction(&this->validator_,&pMVar13->loc,&local_108);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_108);
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    do {
      if (pMVar13->type_ == Table) {
        elem_type.enum_ = pMVar13[1].type_;
        elem_type.type_index_ = *(Index *)&pMVar13[1].field_0x3c;
        RVar11 = SharedValidator::OnTable
                           (&this->validator_,&pMVar13->loc,elem_type,
                            (Limits *)&pMVar13[1].loc.filename._M_str);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    do {
      if (pMVar13->type_ == Memory) {
        RVar11 = SharedValidator::OnMemory
                           (&this->validator_,&pMVar13->loc,
                            (Limits *)&pMVar13[1].loc.filename._M_str,pMVar13[1].type_);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar13->type_ == Global) {
        RVar11 = SharedValidator::OnGlobal
                           (pSVar1,&pMVar13->loc,(Type)pMVar13[1].loc.filename._M_str,
                            (bool)pMVar13[1].loc.field_1.field2[0]);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        RVar11 = SharedValidator::BeginInitExpr
                           (pSVar1,&pMVar13->loc,(Type)pMVar13[1].loc.filename._M_str);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        ExprVisitor::ExprVisitor(&local_2e8,&this->super_Delegate);
        RVar11 = ExprVisitor::VisitExprList
                           (&local_2e8,(ExprList *)((long)&pMVar13[1].loc.field_1 + 8));
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        RVar11 = SharedValidator::EndInitExpr(pSVar1);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        if (local_2e8.catch_index_stack_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2e8.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2e8.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2e8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((TypeMut *)
            local_2e8.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
          operator_delete(local_2e8.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2e8.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    do {
      if (pMVar13->type_ == Tag) {
        GetFuncTypeIndex(&local_150,this,&pMVar13->loc,
                         (FuncDeclaration *)&pMVar13[1].loc.filename._M_str);
        RVar11 = SharedValidator::OnTag(&this->validator_,&pMVar13->loc,&local_150);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_150);
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    do {
      if (pMVar13->type_ == Export) {
        kind = *(ExternalKind *)&pMVar13[1].loc.filename._M_str;
        Var::Var(&local_198,(Var *)&pMVar13[1].loc.field_1.field_0);
        name._M_str = (char *)pMVar13[1]._vptr_ModuleField;
        name._M_len = (size_t)pMVar13[1].super_intrusive_list_base<wabt::ModuleField>.next_;
        RVar11 = SharedValidator::OnExport(&this->validator_,&pMVar13->loc,kind,&local_198,name);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_198);
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    do {
      if (pMVar13->type_ == Start) {
        Var::Var(&local_1e0,(Var *)(pMVar13 + 1));
        RVar11 = SharedValidator::OnStart(&this->validator_,&pMVar13->loc,&local_1e0);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_1e0);
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    local_2f0.enum_ = I64;
    local_2f0.type_index_ = 0;
    do {
      if (pMVar13->type_ == ElemSegment) {
        pLVar12 = &pMVar13->loc;
        paVar2 = &pMVar13[1].loc.field_1;
        Var::Var(&local_228,(Var *)&paVar2->field_0);
        RVar11 = SharedValidator::OnElemSegment
                           (pSVar1,pLVar12,&local_228,*(SegmentKind *)&pMVar13[1]._vptr_ModuleField)
        ;
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_228);
        RVar11 = SharedValidator::OnElemSegmentElemType
                           (pSVar1,pLVar12,*(Type *)((long)&pMVar13[2].loc.field_1 + 8));
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        if (*(int *)&pMVar13[1]._vptr_ModuleField == 0) {
          IVar10 = Module::GetTableIndex(this_00,(Var *)&paVar2->field_0);
          ppTVar7 = (this_00->tables).
                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          type.enum_ = I32;
          type.type_index_ = 0;
          if (((ulong)IVar10 <
               (ulong)((long)(this_00->tables).
                             super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3)) &&
             ((ppTVar7[IVar10]->elem_limits).is_64 != false)) {
            type = local_2f0;
          }
          RVar11 = SharedValidator::BeginInitExpr(pSVar1,pLVar12,type);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::ExprVisitor(&local_2e8,&this->super_Delegate);
          RVar11 = ExprVisitor::VisitExprList(&local_2e8,(ExprList *)&pMVar13[2].type_);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          RVar11 = SharedValidator::EndInitExpr(pSVar1);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          if (local_2e8.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.catch_index_stack_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2e8.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2e8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((TypeMut *)
              local_2e8.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
            operator_delete(local_2e8.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        pMVar8 = (ModuleField *)pMVar13[3].loc.filename._M_len;
        for (exprs = pMVar13[3].super_intrusive_list_base<wabt::ModuleField>.prev_; exprs != pMVar8;
            exprs = (ModuleField *)&exprs->loc) {
          if ((exprs->super_intrusive_list_base<wabt::ModuleField>).prev_ == (ModuleField *)0x0) {
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,0x18a,
                          "typename intrusive_list<T>::const_reference wabt::intrusive_list<wabt::Expr>::front() const [T = wabt::Expr]"
                         );
          }
          RVar11 = SharedValidator::BeginInitExpr
                             (pSVar1,(Location *)(exprs->_vptr_ModuleField + 3),
                              *(Type *)((long)&pMVar13[2].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::ExprVisitor(&local_2e8,&this->super_Delegate);
          RVar11 = ExprVisitor::VisitExprList(&local_2e8,(ExprList *)exprs);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          RVar11 = SharedValidator::EndInitExpr(pSVar1);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          if (local_2e8.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.catch_index_stack_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2e8.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2e8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((TypeMut *)
              local_2e8.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
            operator_delete(local_2e8.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pSVar1 = &this->validator_;
  SharedValidator::OnDataCount
            (pSVar1,(Index)((ulong)((long)(this_00->data_segments).
                                          super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_00->data_segments).
                                         super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    IVar10 = this_00->num_func_imports;
    do {
      if (pMVar13->type_ == Func) {
        loc = &pMVar13[5].super_intrusive_list_base<wabt::ModuleField>;
        pLVar12 = (Location *)loc;
        if (pMVar13[5]._vptr_ModuleField != (_func_int **)0x0) {
          pLVar12 = (Location *)(*(long *)&pMVar13[4].type_ + 0x18);
        }
        RVar11 = SharedValidator::BeginFunctionBody(pSVar1,(Location *)loc,IVar10);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        pTVar6 = (Type *)pMVar13[3].loc.field_1.field_1.offset;
        for (pTVar14 = (Type *)pMVar13[3].loc.filename._M_str; pTVar14 != pTVar6;
            pTVar14 = (Type *)&pTVar14[1].type_index_) {
          RVar11 = SharedValidator::OnLocalDecl(pSVar1,(Location *)loc,pTVar14[1].enum_,*pTVar14);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        }
        ExprVisitor::ExprVisitor(&local_2e8,&this->super_Delegate);
        RVar11 = ExprVisitor::VisitExprList
                           (&local_2e8,(ExprList *)((long)&pMVar13[4].loc.field_1 + 8));
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        RVar11 = SharedValidator::EndFunctionBody(pSVar1,pLVar12);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        if (local_2e8.catch_index_stack_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2e8.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2e8.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2e8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2e8.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2e8.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((TypeMut *)
            local_2e8.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
          operator_delete(local_2e8.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2e8.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2e8.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        IVar10 = IVar10 + 1;
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  pMVar13 = (this_00->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    local_2f8.enum_ = I64;
    local_2f8.type_index_ = 0;
    do {
      if (pMVar13->type_ == DataSegment) {
        paVar2 = &pMVar13[1].loc.field_1;
        Var::Var(&local_270,(Var *)&paVar2->field_0);
        RVar11 = SharedValidator::OnDataSegment
                           (pSVar1,&pMVar13->loc,&local_270,
                            *(SegmentKind *)&pMVar13[1]._vptr_ModuleField);
        (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_270);
        if (*(int *)&pMVar13[1]._vptr_ModuleField == 0) {
          IVar10 = Module::GetMemoryIndex(this_00,(Var *)&paVar2->field_0);
          ppMVar9 = (this_00->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          type_00.enum_ = I32;
          type_00.type_index_ = 0;
          if (((ulong)IVar10 <
               (ulong)((long)(this_00->memories).
                             super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar9 >> 3)) &&
             ((ppMVar9[IVar10]->page_limits).is_64 != false)) {
            type_00 = local_2f8;
          }
          RVar11 = SharedValidator::BeginInitExpr(pSVar1,&pMVar13->loc,type_00);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          ExprVisitor::ExprVisitor(&local_2e8,&this->super_Delegate);
          RVar11 = ExprVisitor::VisitExprList
                             (&local_2e8,(ExprList *)((long)&pMVar13[2].loc.field_1 + 8));
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          RVar11 = SharedValidator::EndInitExpr(pSVar1);
          (this->result_).enum_ = (uint)(RVar11.enum_ == Error || (this->result_).enum_ == Error);
          if (local_2e8.catch_index_stack_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.catch_index_stack_.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.catch_index_stack_.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2e8.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.expr_iter_stack_.
                                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_2e8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e8.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e8.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.expr_stack_.
                                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((TypeMut *)
              local_2e8.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (TypeMut *)0x0) {
            operator_delete(local_2e8.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e8.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
  }
  RVar11 = SharedValidator::EndModule(pSVar1);
  RVar11.enum_._0_1_ = RVar11.enum_ == Error || (this->result_).enum_ == Error;
  RVar11.enum_._1_3_ = 0;
  (this->result_).enum_ = RVar11.enum_;
  return (Result)RVar11.enum_;
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(
              field.loc, func_type->sig.param_types.size(),
              func_type->sig.param_types.data(),
              func_type->sig.result_types.size(),
              func_type->sig.result_types.data(),
              module->GetFuncTypeIndex(func_type->sig));
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits,
                                         memory.page_size);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Tag: {
          auto&& tag = cast<TagImport>(f->import.get())->tag;
          result_ |= validator_.OnTag(field.loc,
                                      GetFuncTypeIndex(field.loc, tag.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits,
                                     f->memory.page_size);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      // Init expr.
      result_ |= validator_.BeginInitExpr(field.loc, f->global.type);
      ExprVisitor visitor(this);
      result_ |=
          visitor.VisitExprList(const_cast<ExprList&>(f->global.init_expr));
      result_ |= validator_.EndInitExpr();
    }
  }

  // Tag section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TagModuleField>(&field)) {
      result_ |=
          validator_.OnTag(field.loc, GetFuncTypeIndex(field.loc, f->tag.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      result_ |= validator_.OnElemSegmentElemType(field.loc,
                                                  f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.kind == SegmentKind::Active) {
        Type offset_type = Type::I32;
        Index table_index = module->GetTableIndex(f->elem_segment.table_var);
        if (table_index < module->tables.size() &&
            module->tables[table_index]->elem_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->elem_segment.offset));
        result_ |= validator_.EndInitExpr();
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        result_ |= validator_.BeginInitExpr(elem_expr.front().loc,
                                            f->elem_segment.elem_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(const_cast<ExprList&>(elem_expr));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      const Location& body_start = f->func.loc;
      const Location& body_end =
          f->func.exprs.empty() ? body_start : f->func.exprs.back().loc;
      result_ |= validator_.BeginFunctionBody(body_start, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        result_ |= validator_.OnLocalDecl(body_start, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(body_end);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(field.loc, f->data_segment.memory_var,
                                          f->data_segment.kind);

      // Init expr.
      if (f->data_segment.kind == SegmentKind::Active) {
        Type offset_type = Type::I32;
        Index memory_index = module->GetMemoryIndex(f->data_segment.memory_var);
        if (memory_index < module->memories.size() &&
            module->memories[memory_index]->page_limits.is_64) {
          offset_type = Type::I64;
        }
        result_ |= validator_.BeginInitExpr(field.loc, offset_type);
        ExprVisitor visitor(this);
        result_ |= visitor.VisitExprList(
            const_cast<ExprList&>(f->data_segment.offset));
        result_ |= validator_.EndInitExpr();
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}